

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

PtrTokenOrSyntax * __thiscall
slang::syntax::CoverageBinsArraySizeSyntax::getChildPtr
          (CoverageBinsArraySizeSyntax *this,size_t index)

{
  long in_RSI;
  PtrTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffc8;
  undefined8 local_10;
  
  if (in_RSI == 0) {
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,(Token *)in_stack_ffffffffffffffc8);
  }
  else if (in_RSI == 1) {
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
  }
  else if (in_RSI == 2) {
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,(Token *)in_stack_ffffffffffffffc8);
  }
  else {
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
  }
  return local_10;
}

Assistant:

PtrTokenOrSyntax CoverageBinsArraySizeSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &openBracket;
        case 1: return expr;
        case 2: return &closeBracket;
        default: return nullptr;
    }
}